

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixPic.cpp
# Opt level: O0

HighsStatus
writeMatrixPicToFile
          (HighsOptions *options,string *fileprefix,HighsInt numRow,HighsInt numCol,
          vector<int,_std::allocator<int>_> *Astart,vector<int,_std::allocator<int>_> *Aindex)

{
  int iVar1;
  int iVar2;
  HighsStatus HVar3;
  const_reference pvVar4;
  reference pvVar5;
  int in_ECX;
  int in_EDX;
  string *in_RSI;
  vector<int,_std::allocator<int>_> *in_R8;
  vector<int,_std::allocator<int>_> *in_R9;
  HighsInt iRow_2;
  HighsInt iRow_1;
  HighsInt iEl_1;
  HighsInt iCol;
  HighsInt iRow;
  HighsInt iEl;
  HighsInt numNz;
  vector<int,_std::allocator<int>_> ARindex;
  vector<int,_std::allocator<int>_> ARstart;
  vector<int,_std::allocator<int>_> ARlength;
  vector<int,_std::allocator<int>_> *in_stack_00000208;
  vector<int,_std::allocator<int>_> *in_stack_00000210;
  HighsInt in_stack_00000218;
  HighsInt in_stack_0000021c;
  string *in_stack_00000220;
  HighsOptions *in_stack_00000228;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  value_type vVar6;
  undefined4 in_stack_ffffffffffffff2c;
  string local_c0 [36];
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  undefined4 local_78;
  value_type local_74;
  vector<int,_std::allocator<int>_> local_70;
  vector<int,_std::allocator<int>_> local_58;
  vector<int,_std::allocator<int>_> local_40;
  vector<int,_std::allocator<int>_> *local_28;
  vector<int,_std::allocator<int>_> *local_20;
  int local_18;
  int local_14;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7e291c);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7e2929);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7e2936);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_18);
  local_74 = *pvVar4;
  local_78 = 0;
  std::vector<int,_std::allocator<int>_>::assign
            (in_stack_ffffffffffffff10,CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
             ,(value_type_conflict2 *)0x7e2979);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RSI,
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RSI,
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  for (local_88 = 0; local_88 < local_74; local_88 = local_88 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)local_88);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)*pvVar4);
    *pvVar5 = *pvVar5 + 1;
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,0);
  *pvVar5 = 0;
  for (local_8c = 0; local_8c < local_14; local_8c = local_8c + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_8c);
    vVar6 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_8c);
    iVar2 = vVar6 + *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)(local_8c + 1));
    *pvVar5 = iVar2;
  }
  for (local_90 = 0; local_90 < local_18; local_90 = local_90 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_90);
    local_94 = *pvVar4;
    while( true ) {
      in_stack_ffffffffffffff24 = local_94;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)(local_90 + 1));
      if (*pvVar4 <= in_stack_ffffffffffffff24) break;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)local_94);
      local_98 = *pvVar4;
      in_stack_ffffffffffffff20 = local_90;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_98);
      iVar2 = *pvVar5;
      *pvVar5 = iVar2 + 1;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)iVar2);
      *pvVar5 = in_stack_ffffffffffffff20;
      local_94 = local_94 + 1;
    }
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,0);
  *pvVar5 = 0;
  for (local_9c = 0; local_9c < local_14; local_9c = local_9c + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_9c);
    iVar2 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_9c);
    iVar1 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)(local_9c + 1));
    *pvVar5 = iVar2 + iVar1;
  }
  std::__cxx11::string::string(local_c0,in_RSI);
  HVar3 = writeRmatrixPicToFile
                    (in_stack_00000228,in_stack_00000220,in_stack_0000021c,in_stack_00000218,
                     in_stack_00000210,in_stack_00000208);
  std::__cxx11::string::~string(local_c0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  return HVar3;
}

Assistant:

HighsStatus writeMatrixPicToFile(const HighsOptions& options,
                                 const std::string fileprefix,
                                 const HighsInt numRow, const HighsInt numCol,
                                 const std::vector<HighsInt>& Astart,
                                 const std::vector<HighsInt>& Aindex) {
  std::vector<HighsInt> ARlength;
  std::vector<HighsInt> ARstart;
  std::vector<HighsInt> ARindex;
  assert(numRow > 0);
  assert(numCol > 0);
  const HighsInt numNz = Astart[numCol];
  ARlength.assign(numRow, 0);
  ARstart.resize(numRow + 1);
  ARindex.resize(numNz);
  for (HighsInt iEl = 0; iEl < numNz; iEl++) ARlength[Aindex[iEl]]++;
  ARstart[0] = 0;
  for (HighsInt iRow = 0; iRow < numRow; iRow++)
    ARstart[iRow + 1] = ARstart[iRow] + ARlength[iRow];
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    for (HighsInt iEl = Astart[iCol]; iEl < Astart[iCol + 1]; iEl++) {
      HighsInt iRow = Aindex[iEl];
      ARindex[ARstart[iRow]++] = iCol;
    }
  }
  ARstart[0] = 0;
  for (HighsInt iRow = 0; iRow < numRow; iRow++)
    ARstart[iRow + 1] = ARstart[iRow] + ARlength[iRow];

  return writeRmatrixPicToFile(options, fileprefix, numRow, numCol, ARstart,
                               ARindex);
}